

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_external_fixups.hpp
# Opt level: O2

void compare_external_fixups<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
               (database *export_db,
               vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
               *exported_fixups,database *import_db,
               vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
               *imported_fixups)

{
  string_address sVar1;
  vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> *extraout_RDX;
  vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> *rhs;
  vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
  *extraout_RDX_00;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>
  *matcher;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  char *pcVar2;
  _func_int **message;
  pointer addr;
  anon_class_1_0_00000001 load_string;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  raw_sstring_view local_c8;
  shared_sstring_view export_owner;
  pointer local_98;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_90;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_88;
  vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> *local_80;
  testing *local_78;
  pointer local_70;
  database *local_68;
  database *local_60;
  raw_sstring_view local_58;
  _Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> local_48
  ;
  
  export_owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((long)(exported_fixups->
              super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(exported_fixups->
              super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
              )._M_impl.super__Vector_impl_data._M_start >> 5);
  gtest_ar_1._0_8_ =
       (long)(imported_fixups->
             super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
             )._M_impl.super__Vector_impl_data._M_finish -
       (long)(imported_fixups->
             super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
             )._M_impl.super__Vector_impl_data._M_start >> 5;
  local_68 = export_db;
  local_60 = import_db;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"exported_fixups.size ()","imported_fixups.size ()",
             (unsigned_long *)&export_owner,(unsigned_long *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&export_owner);
    std::operator<<((ostream *)
                    (export_owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr + 0x10),
                    "Expected the number of xfixups imported to match the number we started with");
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/compare_external_fixups.hpp"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&export_owner)
    ;
    this = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (export_owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (**(code **)(*(long *)export_owner.ptr_.
                            super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8))
                ();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    local_98 = (imported_fixups->
               super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_70 = (exported_fixups->
               super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    rhs = extraout_RDX;
    local_80 = imported_fixups;
    local_78 = (testing *)exported_fixups;
    for (addr = (exported_fixups->
                super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                )._M_impl.super__Vector_impl_data._M_start; addr != local_70; addr = addr + 1) {
      export_owner.size_ = 0;
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      export_owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      export_owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      sVar1.a_.a_ = (address)(local_98->name).a_.a_;
      local_88.ptr_ = (sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar;
      pstore::gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant
                (&local_88);
      local_c8 = compare_external_fixups<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
                 ::anon_class_1_0_00000001::operator()(&load_string,local_60,sVar1,local_88);
      sVar1.a_.a_ = (address)(addr->name).a_.a_;
      local_90.ptr_ = &export_owner;
      pstore::gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant
                (&local_90);
      local_58 = compare_external_fixups<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
                 ::anon_class_1_0_00000001::operator()(&load_string,local_68,sVar1,local_90);
      testing::internal::
      CmpHelperEQ<pstore::sstring_view<char_const*>,pstore::sstring_view<char_const*>>
                ((internal *)&gtest_ar_1,"load_string (import_db, import_it->name, &import_owner)",
                 "load_string (export_db, export_it->name, &export_owner)",&local_c8,&local_58);
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&local_c8);
        std::operator<<((ostream *)(local_c8.ptr_ + 0x10),"Names of fixup #");
        std::ostream::_M_insert<unsigned_long>((ulong)(local_c8.ptr_ + 0x10));
        std::operator<<((ostream *)(local_c8.ptr_ + 0x10),". exported name:");
        pstore::operator<<((ostream *)(local_c8.ptr_ + 0x10),&addr->name);
        std::operator<<((ostream *)(local_c8.ptr_ + 0x10),", imported name:");
        pstore::operator<<((ostream *)(local_c8.ptr_ + 0x10),&local_98->name);
        pcVar2 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/compare_external_fixups.hpp"
                   ,0x3a,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
        if ((long *)local_c8.ptr_ != (long *)0x0) {
          (**(code **)(*(long *)local_c8.ptr_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_1.message_);
      (local_98->name).a_.a_ = 0;
      (addr->name).a_.a_ = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&export_owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
      local_98 = local_98 + 1;
      rhs = extraout_RDX_00;
    }
    testing::
    ContainerEq<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
              ((PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>
                *)&local_48,local_78,rhs);
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>>>
              ((PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>_>
                *)&gtest_ar,(internal *)&local_48,matcher);
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>>>
    ::operator()(&export_owner,&gtest_ar.success_,
                 (vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                  *)"imported_fixups");
    std::_Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::
    ~_Vector_base((_Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                   *)&gtest_ar);
    std::_Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::
    ~_Vector_base(&local_48);
    if ((char)export_owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        '\0') {
      testing::Message::Message((Message *)&gtest_ar);
      std::operator<<((ostream *)(gtest_ar._0_8_ + 0x10),
                      "The imported and exported xfixups should match");
      if (export_owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        message = (_func_int **)0x1c5bef;
      }
      else {
        message = (export_owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_vptr__Sp_counted_base;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/compare_external_fixups.hpp"
                 ,0x45,(char *)message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      if (gtest_ar._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
    this = &export_owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this);
  return;
}

Assistant:

void compare_external_fixups (pstore::database const & export_db,
                              ExportsContainer & exported_fixups,
                              pstore::database const & import_db,
                              ImportsContainer & imported_fixups) {

    ASSERT_EQ (exported_fixups.size (), imported_fixups.size ())
        << "Expected the number of xfixups imported to match the number we started with";

    using string_address = pstore::typed_address<pstore::indirect_string>;

    auto const load_string = [] (pstore::database const & db, string_address const addr,
                                 pstore::gsl::not_null<pstore::shared_sstring_view *> const owner) {
        return pstore::indirect_string::read (db, addr).as_string_view (owner);
    };

    // The name fields are tricky here. The imported and exported fixups are from different
    // databases so we can't simply compare string addresses to find out if they point to the
    // same string. Instead we must load each of the strings and compare them directly.
    // However, we still want to use operator== for all of the other fields so that we don't
    // end up having to duplicate the rest of the comparison method here. Setting both name
    // fields to 0 after comparison allows us to do that.
    {
        auto import_it = std::begin (imported_fixups);
        auto export_it = std::begin (exported_fixups);
        auto const export_end = std::end (exported_fixups);
        auto count = std::size_t{0};
        for (; export_it != export_end; ++import_it, ++export_it, ++count) {
            pstore::shared_sstring_view import_owner;
            pstore::shared_sstring_view export_owner;
            EXPECT_EQ (load_string (import_db, import_it->name, &import_owner),
                       load_string (export_db, export_it->name, &export_owner))
                << "Names of fixup #" << count << ". exported name:" << export_it->name
                << ", imported name:" << import_it->name;

            // Set the import and export name values to the same address (it doesn't matter what
            // that address is). This will mean that differences won't cause failures as we
            // compare the two containers.
            export_it->name = import_it->name = string_address ();
        }
    }

    EXPECT_THAT (imported_fixups, testing::ContainerEq (exported_fixups))
        << "The imported and exported xfixups should match";
}